

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty_test.cc
# Opt level: O0

void __thiscall
BloatyTest_SimpleBinary_Test::BloatyTest_SimpleBinary_Test(BloatyTest_SimpleBinary_Test *this)

{
  BloatyTest *in_RDI;
  
  BloatyTest::BloatyTest(in_RDI);
  (in_RDI->super_Test)._vptr_Test = (_func_int **)&PTR__BloatyTest_SimpleBinary_Test_00917ff0;
  return;
}

Assistant:

TEST_F(BloatyTest, SimpleBinary) {
  std::string file = "05-binary.bin";
  uint64_t size;
  ASSERT_TRUE(GetFileSize(file, &size));

  RunBloaty({"bloaty", file});
  EXPECT_GT(top_row_->size.vm, 8000);
  EXPECT_LT(top_row_->size.vm, 12000);
  EXPECT_EQ(top_row_->size.file, size);
  EXPECT_GT(top_row_->sorted_children.size(), 3);

  RunBloaty({"bloaty", "-d", "segments", file});
  EXPECT_GT(top_row_->size.vm, 8000);
  EXPECT_LT(top_row_->size.vm, 12000);
  EXPECT_EQ(top_row_->size.file, size);

  RunBloaty({"bloaty", "-d", "symbols", "-n", "50", "-s", "vm", file});
  AssertChildren(*top_row_, {
    std::make_tuple("bar_x", 4000, 4000),
    std::make_tuple("foo_x", 4000, 0),
    std::make_tuple("bar_func", kUnknown, kSameAsVM),
    std::make_tuple("foo_func", kUnknown, kSameAsVM),
    std::make_tuple("main", kUnknown, kSameAsVM),
    std::make_tuple("bar_y", 4, 4),
    std::make_tuple("bar_z", 4, 0),
    std::make_tuple("foo_y", 4, 0)
  });

  RunBloaty({"bloaty", "-d", "compileunits,symbols", file});
  auto row = FindRow("bar.o.c");
  ASSERT_TRUE(row != nullptr);

  // This only includes functions (not data) for now.
  AssertChildren(*row, {
    std::make_tuple("bar_x", 4000, kSameAsVM),
    std::make_tuple("bar_func", kUnknown, kSameAsVM),
    std::make_tuple("bar_y", kUnknown, kSameAsVM),
    std::make_tuple("bar_z", kUnknown, kSameAsVM),
  });

  row = FindRow("foo.o.c");
  ASSERT_TRUE(row != nullptr);

  // This only includes functions (not data) for now.
  AssertChildren(*row, {
    std::make_tuple("foo_x", 4000, 0),
    std::make_tuple("foo_func", kUnknown, kSameAsVM),
    std::make_tuple("foo_y", kUnknown, kSameAsVM),
  });

  RunBloaty({"bloaty", "-d", "sections,inlines", file});
}